

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapES5ArrayInfo
               (SnapObject *snpObject,RecyclableObject *obj,InflateMap *inflator)

{
  SnapES5ArrayInfo *pSVar1;
  SnapES5ArrayGetterSetterEntry *pSVar2;
  Var local_50;
  Var setter;
  Var getter;
  SnapES5ArrayGetterSetterEntry *entry;
  uint32 i;
  JavascriptArray *arrayObj;
  SnapES5ArrayInfo *es5Info;
  InflateMap *inflator_local;
  RecyclableObject *obj_local;
  SnapObject *snpObject_local;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapES5ArrayInfo*,(TTD::NSSnapObjects::SnapObjectType)22>
                     (snpObject);
  DoAddtlValueInstantiation_SnapArrayInfoCore<void*,void*>
            (pSVar1->BasicArrayData,(JavascriptArray *)obj,inflator);
  for (entry._4_4_ = 0; entry._4_4_ < pSVar1->GetterSetterCount; entry._4_4_ = entry._4_4_ + 1) {
    pSVar2 = pSVar1->GetterSetterEntries + entry._4_4_;
    setter = (Var)0x0;
    if (pSVar2->Getter != (TTDVar)0x0) {
      setter = InflateMap::InflateTTDVar(inflator,pSVar2->Getter);
    }
    local_50 = (Var)0x0;
    if (pSVar2->Setter != (TTDVar)0x0) {
      local_50 = InflateMap::InflateTTDVar(inflator,pSVar2->Setter);
    }
    if ((setter != (Var)0x0) || (local_50 != (Var)0x0)) {
      (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
        [0x6d])(obj,(ulong)pSVar2->Index,setter,local_50);
    }
    (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6c]
    )(obj,(ulong)pSVar2->Index,(ulong)pSVar2->Attributes);
  }
  Js::JavascriptLibrary::SetLengthWritableES5Array_TTD(obj,(bool)(pSVar1->IsLengthWritable & 1));
  return;
}

Assistant:

void DoAddtlValueInstantiation_SnapES5ArrayInfo(const SnapObject* snpObject, Js::RecyclableObject* obj, InflateMap* inflator)
        {
            SnapES5ArrayInfo* es5Info = SnapObjectGetAddtlInfoAs<SnapES5ArrayInfo*, SnapObjectType::SnapES5ArrayObject>(snpObject);

            Js::JavascriptArray* arrayObj = static_cast<Js::JavascriptArray*>(obj);
            DoAddtlValueInstantiation_SnapArrayInfoCore<TTDVar, Js::Var>(es5Info->BasicArrayData, arrayObj, inflator);

            for(uint32 i = 0; i < es5Info->GetterSetterCount; ++i)
            {
                const SnapES5ArrayGetterSetterEntry* entry = es5Info->GetterSetterEntries + i;

                Js::Var getter = nullptr;
                if(entry->Getter != nullptr)
                {
                    getter = inflator->InflateTTDVar(entry->Getter);
                }

                Js::Var setter = nullptr;
                if(entry->Setter != nullptr)
                {
                    setter = inflator->InflateTTDVar(entry->Setter);
                }

                if(getter != nullptr || setter != nullptr)
                {
                    arrayObj->SetItemAccessors(entry->Index, getter, setter);
                }

                arrayObj->SetItemAttributes(entry->Index, entry->Attributes);
            }

            //do length writable as needed
            Js::JavascriptLibrary::SetLengthWritableES5Array_TTD(arrayObj, es5Info->IsLengthWritable);
        }